

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

bool __thiscall
ON_RenderContent::SetChildSlotAmount(ON_RenderContent *this,double amount,wchar_t *child_slot_name)

{
  int iVar1;
  wchar_t *pwVar2;
  ON_wString s;
  ON_wString OStack_118;
  double local_110;
  ON_XMLVariant local_108;
  
  local_110 = amount;
  ON_wString::ON_wString((ON_wString *)&local_108,child_slot_name);
  ON_wString::operator+(&OStack_118,(wchar_t *)&local_108);
  ON_wString::~ON_wString((ON_wString *)&local_108);
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&OStack_118);
  ::ON_XMLVariant::ON_XMLVariant(&local_108,local_110 / 100.0);
  iVar1 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x2e])
                    (this,pwVar2,&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ON_wString::~ON_wString(&OStack_118);
  return SUB41(iVar1,0);
}

Assistant:

bool ON_RenderContent::SetChildSlotAmount(double amount, const wchar_t* child_slot_name)
{
  const auto s = ON_wString(child_slot_name) + L"-" MAT_POSTFIX_DOUBLE_AMOUNT;

  return SetParameter(s, amount / 100.0);
}